

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

_Bool trans_LDREXD_a32(DisasContext_conflict1 *s,arg_LDREX *a)

{
  ulong uVar1;
  
  uVar1 = s->features;
  if ((uVar1 & 0x10) != 0) {
    if ((a->rt & 1U) == 0) {
      a->rt2 = a->rt | 1;
      op_ldrex(s,a,MO_64,false);
    }
    else {
      unallocated_encoding_aarch64(s);
    }
  }
  return SUB41(((uint)uVar1 & 0x10) >> 4,0);
}

Assistant:

static bool trans_LDREXD_a32(DisasContext *s, arg_LDREX *a)
{
    if (!ENABLE_ARCH_6K) {
        return false;
    }
    /* We UNDEF for these UNPREDICTABLE cases.  */
    if (a->rt & 1) {
        unallocated_encoding(s);
        return true;
    }
    a->rt2 = a->rt + 1;
    return op_ldrex(s, a, MO_64, false);
}